

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.hpp
# Opt level: O0

void __thiscall gdsNODE::~gdsNODE(gdsNODE *this)

{
  gdsNODE *this_local;
  
  std::__cxx11::string::~string((string *)&this->propvalue);
  std::vector<int,_std::allocator<int>_>::~vector(&this->yCor);
  std::vector<int,_std::allocator<int>_>::~vector(&this->xCor);
  return;
}

Assistant:

gdsNODE(){}